

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

Vec_Int_t * Abc_NtkDressMapClasses(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk)

{
  Vec_Int_t *p;
  Abc_Obj_t *pAVar1;
  ulong uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int Fill;
  int i;
  
  p = Vec_IntAlloc(0);
  Vec_IntFill(p,pNtk->vObjs->nSize,Fill);
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar1 = Abc_NtkObj(pNtk,i);
    if (((((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) &&
         (uVar2 = (ulong)(pAVar1->field_6).pTemp & 0xfffffffffffffffe, uVar2 != 0)) &&
        (((*(byte *)(uVar2 + 0x14) & 0xf) != 0 &&
         (uVar2 = *(ulong *)(uVar2 + 0x40) & 0xfffffffffffffffe, uVar2 != 0)))) &&
       (((*(byte *)(uVar2 + 0x18) & 7) != 0 &&
        ((pAVar3 = (Aig_Obj_t *)(*(ulong *)(uVar2 + 0x28) & 0xfffffffffffffffe),
         pAVar3 != (Aig_Obj_t *)0x0 && ((pAVar3->field_0x18 & 7) != 0)))))) {
      if (pMiter->pReprs == (Aig_Obj_t **)0x0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = pMiter->pReprs[pAVar3->Id];
      }
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        pAVar3 = pAVar4;
      }
      Vec_IntWriteEntry(p,i,pAVar3->Id);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkDressMapClasses( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vId2Lit;
    Abc_Obj_t * pObj, * pAnd;
    Aig_Obj_t * pObjMan, * pObjMiter, * pObjRepr;
    int i;
    vId2Lit = Vec_IntAlloc( 0 );
    Vec_IntFill( vId2Lit, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // get the pointer to the miter node corresponding to pObj
        if ( (pAnd = Abc_ObjRegular(pObj->pCopy)) && Abc_ObjType(pAnd) != ABC_OBJ_NONE &&          // strashed node is present and legal
             (pObjMan = Aig_Regular((Aig_Obj_t *)pAnd->pCopy)) && Aig_ObjType(pObjMan) != AIG_OBJ_NONE &&       // AIG node is present and legal
             (pObjMiter = Aig_Regular((Aig_Obj_t *)pObjMan->pData)) && Aig_ObjType(pObjMiter) != AIG_OBJ_NONE ) // miter node is present and legal
        {
            // get the representative of the miter node
            pObjRepr = Aig_ObjRepr( pMiter, pObjMiter );
            pObjRepr = pObjRepr? pObjRepr : pObjMiter;
            // map pObj (whose ID is i) into the repr node ID (i.e. equiv class)
            Vec_IntWriteEntry( vId2Lit, i, Aig_ObjId(pObjRepr) );
        }
    }
    return vId2Lit;
}